

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

uint16_t lha_crc16(uint16_t crc,void *pp,size_t len)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  uchar *buff;
  size_t len_local;
  void *pp_local;
  uint16_t crc_local;
  
  buff = (uchar *)pp;
  crc_local = crc;
  for (len_local = len; 7 < len_local; len_local = len_local - 8) {
    pbVar2 = buff + 1;
    bVar1 = *buff;
    pbVar3 = buff + 2;
    pbVar4 = buff + 3;
    pbVar5 = buff + 4;
    pbVar6 = buff + 5;
    pbVar7 = buff + 6;
    pbVar8 = buff + 7;
    buff = buff + 8;
    crc_local = crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)
                                                  (ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)crc_local ^
                                                                               (uint)bVar1) & 0xff)]
                                                               ^ crc_local >> 8) ^ (uint)*pbVar2) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)crc_local ^
                                                                          (uint)bVar1) & 0xff)] >> 8
                                                  ) ^ (uint)*pbVar3) & 0xff)] >> 8) ^ (uint)*pbVar5)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] ^ crc_local >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] >> 8) ^ (uint)*pbVar6) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)crc_local ^
                                                                               (uint)bVar1) & 0xff)]
                                                               ^ crc_local >> 8) ^ (uint)*pbVar2) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)crc_local ^
                                                                          (uint)bVar1) & 0xff)] >> 8
                                                  ) ^ (uint)*pbVar3) & 0xff)] >> 8) ^ (uint)*pbVar5)
                                                  & 0xff)] >> 8) ^ (uint)*pbVar7) & 0xff)] ^
                                              crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(
                                                  ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                  0xff)] ^ crc_local >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)crc_local ^
                                                                               (uint)bVar1) & 0xff)]
                                                               ^ crc_local >> 8) ^ (uint)*pbVar2) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)crc_local ^
                                                                          (uint)bVar1) & 0xff)] >> 8
                                                  ) ^ (uint)*pbVar3) & 0xff)] >> 8) ^ (uint)*pbVar5)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] ^ crc_local >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] >> 8) ^ (uint)*pbVar6) &
                                                  0xff)] >> 8) ^ (uint)*pbVar8) & 0xff)] ^
                crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)
                                                  (ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)(ushort)(crc16tbl[(int)(((uint)(ushort
                                                  )(crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                  0xff)] ^ crc_local >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)crc_local ^
                                                                               (uint)bVar1) & 0xff)]
                                                               ^ crc_local >> 8) ^ (uint)*pbVar2) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)crc_local ^
                                                                          (uint)bVar1) & 0xff)] >> 8
                                                  ) ^ (uint)*pbVar3) & 0xff)] >> 8) ^ (uint)*pbVar5)
                                                  & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)(ushort)(
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] ^ crc_local >> 8) ^
                                                  (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] >> 8) ^ (uint)*pbVar6) &
                                                  0xff)] ^
                                              crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((uint)(
                                                  ushort)(crc16tbl[(int)(((uint)(ushort)(crc16tbl[(
                                                  int)(((uint)(ushort)(crc16tbl[(int)(((uint)
                                                  crc_local ^ (uint)bVar1) & 0xff)] ^ crc_local >> 8
                                                  ) ^ (uint)*pbVar2) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)crc_local ^ (uint)bVar1) &
                                                                0xff)] >> 8) ^ (uint)*pbVar3) & 0xff
                                                  )] ^ crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)
                                                  (((uint)crc_local ^ (uint)bVar1) & 0xff)] ^
                                                  crc_local >> 8) ^ (uint)*pbVar2) & 0xff)] >> 8) ^
                                                  (uint)*pbVar4) & 0xff)] ^
                                                  crc16tbl[(int)(((uint)(ushort)(crc16tbl[(int)(((
                                                  uint)(ushort)(crc16tbl[(int)(((uint)crc_local ^
                                                                               (uint)bVar1) & 0xff)]
                                                               ^ crc_local >> 8) ^ (uint)*pbVar2) &
                                                  0xff)] ^ crc16tbl[(int)(((uint)crc_local ^
                                                                          (uint)bVar1) & 0xff)] >> 8
                                                  ) ^ (uint)*pbVar3) & 0xff)] >> 8) ^ (uint)*pbVar5)
                                                  & 0xff)] >> 8) ^ (uint)*pbVar7) & 0xff)] >> 8;
  }
  switch(len_local) {
  case 0:
    return crc_local;
  case 7:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 6:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 5:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 4:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 3:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 2:
    crc_local = crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
    buff = buff + 1;
  case 1:
    return crc16tbl[(int)(((uint)crc_local ^ (uint)*buff) & 0xff)] ^ crc_local >> 8;
  default:
    return crc_local;
  }
}

Assistant:

static uint16_t
lha_crc16(uint16_t crc, const void *pp, size_t len)
{
	const unsigned char *buff = (const unsigned char *)pp;

	while (len >= 8) {
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		CRC16(crc, *buff++); CRC16(crc, *buff++);
		len -= 8;
	}
	switch (len) {
	case 7:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 6:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 5:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 4:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 3:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 2:
		CRC16(crc, *buff++);
		/* FALL THROUGH */
	case 1:
		CRC16(crc, *buff);
		/* FALL THROUGH */
	case 0:
		break;
	}
	return (crc);
}